

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool Socks5(string *strDest,uint16_t port,ProxyCredentials *auth,Sock *sock)

{
  milliseconds timeout;
  milliseconds timeout_00;
  milliseconds timeout_01;
  milliseconds timeout_02;
  milliseconds timeout_03;
  milliseconds timeout_04;
  milliseconds timeout_05;
  milliseconds timeout_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view source_file_14;
  string_view source_file_15;
  string_view source_file_16;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  string_view logging_function_14;
  string_view logging_function_15;
  string_view logging_function_16;
  undefined1 uVar1;
  bool bVar2;
  IntrRecvError IVar3;
  IntrRecvError IVar4;
  size_type sVar5;
  iterator iVar6;
  long *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  runtime_error *e;
  int nRecv;
  IntrRecvError recvr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vSocks5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vAuth;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vSocks5Init;
  uint8_t pchRet2 [4];
  uint8_t pchRetA [2];
  uint8_t pchRet1 [2];
  uint8_t pchRet3 [256];
  undefined4 in_stack_fffffffffffff928;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff92c;
  char *in_stack_fffffffffffff930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff948;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff950;
  undefined6 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95e;
  undefined1 in_stack_fffffffffffff95f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff988;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff990;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  const_iterator in_stack_fffffffffffff998;
  int iVar8;
  uint8_t err;
  IntrRecvError in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  ConstevalFormatString<0U> in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  char *in_stack_fffffffffffff9e8;
  long *plVar9;
  undefined8 in_stack_fffffffffffff9f0;
  undefined1 *puVar10;
  undefined7 in_stack_fffffffffffff9f8;
  Level in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  IntrRecvError local_4f4;
  byte local_4d1;
  undefined8 local_350;
  undefined8 local_348;
  char local_320 [120];
  rep local_2a8;
  rep local_280;
  undefined8 local_278;
  undefined8 local_270;
  uchar *local_268;
  undefined1 local_251;
  uchar *local_250;
  undefined1 local_239;
  undefined1 local_211;
  char local_210 [88];
  rep local_1b8;
  rep local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 local_196;
  undefined1 local_195;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  undefined1 local_190 [96];
  char local_130;
  char local_12f;
  char local_12e;
  char local_12d;
  char local_12c;
  char local_12b;
  char local_12a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_129 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),Trace);
  if ((bool)uVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    in_stack_fffffffffffffaf0 = "SOCKS5 connecting %s\n";
    in_stack_fffffffffffff930 = "SOCKS5 connecting %s\n";
    in_stack_fffffffffffff928 = 1;
    logging_function._M_str._0_7_ = in_stack_fffffffffffff9f8;
    logging_function._M_len = in_stack_fffffffffffff9f0;
    logging_function._M_str._7_1_ = uVar1;
    source_file._M_len._4_4_ = in_stack_fffffffffffff9e4;
    source_file._M_len._0_4_ = in_stack_fffffffffffff9e0;
    source_file._M_str = in_stack_fffffffffffff9e8;
    in_stack_fffffffffffff938 = in_RDI;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,
               (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20),
               (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
               (ConstevalFormatString<1U>)in_stack_fffffffffffff9d8.fmt,in_stack_fffffffffffffae0);
  }
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  if (0xff < sVar5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    iVar8 = (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    logging_function_00._M_str._0_7_ = in_stack_fffffffffffff9f8;
    logging_function_00._M_len = in_stack_fffffffffffff9f0;
    logging_function_00._M_str._7_1_ = uVar1;
    source_file_00._M_len._4_4_ = in_stack_fffffffffffff9e4;
    source_file_00._M_len._0_4_ = in_stack_fffffffffffff9e0;
    source_file_00._M_str = in_stack_fffffffffffff9e8;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,iVar8,
               (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
               in_stack_fffffffffffff9d8);
    local_4d1 = 0;
    goto LAB_019889ba;
  }
  puVar10 = local_190;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_191 = 5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
             (value_type_conflict3 *)0x198744d);
  if (in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_195 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (value_type_conflict3 *)0x19874f3);
    local_196 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (value_type_conflict3 *)0x1987512);
  }
  else {
    local_192 = 2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (value_type_conflict3 *)0x1987477);
    local_193 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (value_type_conflict3 *)0x1987496);
    local_194 = 2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (value_type_conflict3 *)0x19874b5);
  }
  plVar9 = in_RCX;
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff938,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff930,
             (type)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_1b0 = g_socks5_recv_timeout.__r;
  (**(code **)(*plVar9 + 0x80))
            (plVar9,local_1a8,local_1a0,g_socks5_recv_timeout.__r,&g_socks5_interrupt);
  local_1b8 = g_socks5_recv_timeout.__r;
  timeout.__r._4_4_ = in_stack_fffffffffffff9ac;
  timeout.__r._0_4_ = in_stack_fffffffffffff9a8;
  IVar3 = InterruptibleRecv((uint8_t *)
                            CONCAT17(in_stack_fffffffffffff95f,
                                     CONCAT16(in_stack_fffffffffffff95e,in_stack_fffffffffffff958)),
                            (size_t)in_stack_fffffffffffff950,timeout,
                            (Sock *)in_stack_fffffffffffff948);
  if (IVar3 == OK) {
    if (local_12a == '\x05') {
      if (((char)local_129[0]._M_dataplus._M_p == '\x02') &&
         (in_RDX != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        in_stack_fffffffffffff9d8.fmt = local_210;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        local_211 = 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (value_type_conflict3 *)0x1987780);
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        if ((sVar5 < 0x100) &&
           (sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)),
           sVar5 < 0x100)) {
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          local_239 = (undefined1)sVar5;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x198789f);
          local_250 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffff930);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffff938,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffff930);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    (in_stack_fffffffffffff938);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    (in_stack_fffffffffffff950,in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                     in_stack_fffffffffffff988);
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          local_251 = (undefined1)sVar5;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987969);
          local_268 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffff930);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffff938,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffff930);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    (in_stack_fffffffffffff938);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    (in_stack_fffffffffffff950,in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                     in_stack_fffffffffffff988);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffff938,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff930,
                     (type)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          local_280 = g_socks5_recv_timeout.__r;
          (**(code **)(*in_RCX + 0x80))
                    (in_RCX,local_278,local_270,g_socks5_recv_timeout.__r,&g_socks5_interrupt);
          bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                    Trace);
          in_stack_fffffffffffff9ac = CONCAT13(bVar2,(int3)in_stack_fffffffffffff9ac);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
            in_stack_fffffffffffff940 = in_RDX + 1;
            in_stack_fffffffffffff930 = "SOCKS5 sending proxy authentication %s:%s\n";
            in_stack_fffffffffffff928 = 1;
            logging_function_04._M_str._0_7_ = in_stack_fffffffffffff9f8;
            logging_function_04._M_len = (size_t)puVar10;
            logging_function_04._M_str._7_1_ = uVar1;
            source_file_04._M_len._4_4_ = IVar3;
            source_file_04._M_len._0_4_ = in_stack_fffffffffffff9e0;
            source_file_04._M_str = (char *)plVar9;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_04,source_file_04,
                       (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20),
                       (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
                       (ConstevalFormatString<2U>)in_stack_fffffffffffff9d8.fmt,
                       in_stack_fffffffffffffae0,in_stack_fffffffffffffae8);
            in_stack_fffffffffffff938 = in_RDX;
          }
          local_2a8 = g_socks5_recv_timeout.__r;
          timeout_00.__r._4_4_ = in_stack_fffffffffffff9ac;
          timeout_00.__r._0_4_ = in_stack_fffffffffffff9a8;
          in_stack_fffffffffffff9a8 =
               InterruptibleRecv((uint8_t *)
                                 CONCAT17(in_stack_fffffffffffff95f,
                                          CONCAT16(in_stack_fffffffffffff95e,
                                                   in_stack_fffffffffffff958)),
                                 (size_t)in_stack_fffffffffffff950,timeout_00,
                                 (Sock *)in_stack_fffffffffffff948);
          if (in_stack_fffffffffffff9a8 == OK) {
            if ((local_12c == '\x01') && (local_12b == '\0')) {
              bVar2 = false;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
              in_stack_fffffffffffff930 = "Proxy authentication unsuccessful\n";
              in_stack_fffffffffffff928 = 4;
              logging_function_06._M_str._0_7_ = in_stack_fffffffffffff9f8;
              logging_function_06._M_len = (size_t)puVar10;
              logging_function_06._M_str._7_1_ = uVar1;
              source_file_06._M_len._4_4_ = IVar3;
              source_file_06._M_len._0_4_ = in_stack_fffffffffffff9e0;
              source_file_06._M_str = (char *)plVar9;
              LogPrintFormatInternal<>
                        (logging_function_06,source_file_06,
                         (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20),
                         (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
                         in_stack_fffffffffffff9d8);
              local_4d1 = 0;
              bVar2 = true;
            }
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
            in_stack_fffffffffffff930 = "Error reading proxy authentication response\n";
            in_stack_fffffffffffff928 = 4;
            logging_function_05._M_str._0_7_ = in_stack_fffffffffffff9f8;
            logging_function_05._M_len = (size_t)puVar10;
            logging_function_05._M_str._7_1_ = uVar1;
            source_file_05._M_len._4_4_ = IVar3;
            source_file_05._M_len._0_4_ = in_stack_fffffffffffff9e0;
            source_file_05._M_str = (char *)plVar9;
            LogPrintFormatInternal<>
                      (logging_function_05,source_file_05,
                       (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20),
                       (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
                       in_stack_fffffffffffff9d8);
            local_4d1 = 0;
            bVar2 = true;
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
          in_stack_fffffffffffff930 = "Proxy username or password too long\n";
          in_stack_fffffffffffff928 = 4;
          logging_function_03._M_str._0_7_ = in_stack_fffffffffffff9f8;
          logging_function_03._M_len = (size_t)puVar10;
          logging_function_03._M_str._7_1_ = uVar1;
          source_file_03._M_len._4_4_ = IVar3;
          source_file_03._M_len._0_4_ = in_stack_fffffffffffff9e0;
          source_file_03._M_str = (char *)plVar9;
          LogPrintFormatInternal<>
                    (logging_function_03,source_file_03,
                     (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20),
                     (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
                     in_stack_fffffffffffff9d8);
          local_4d1 = 0;
          bVar2 = true;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff938);
        if (!bVar2) {
LAB_01987dc4:
          err = (uint8_t)((ulong)local_320 >> 0x38);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987df0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987e0f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987e2e);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987e4d);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987e78);
          __first._M_current = local_320;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff930);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffff938,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffff930);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    (in_stack_fffffffffffff938);
          iVar6 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                            (in_stack_fffffffffffff950,in_stack_fffffffffffff998,__first,
                             in_stack_fffffffffffff988);
          iVar8 = (int)((ulong)iVar6._M_current >> 0x20);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987f2c);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (value_type_conflict3 *)0x1987f51);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffff938,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff930,
                     (type)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          (**(code **)(*in_RCX + 0x80))
                    (in_RCX,local_350,local_348,g_socks5_recv_timeout.__r,&g_socks5_interrupt);
          timeout_01.__r._4_4_ = in_stack_fffffffffffff9ac;
          timeout_01.__r._0_4_ = in_stack_fffffffffffff9a8;
          IVar4 = InterruptibleRecv((uint8_t *)
                                    CONCAT17(in_stack_fffffffffffff95f,
                                             CONCAT16(in_stack_fffffffffffff95e,
                                                      in_stack_fffffffffffff958)),
                                    (size_t)in_stack_fffffffffffff950,timeout_01,
                                    (Sock *)in_stack_fffffffffffff948);
          if (IVar4 == OK) {
            if (local_130 == '\x05') {
              if (local_12f == '\0') {
                if (local_12e == '\0') {
                  if (local_12d == '\x01') {
                    timeout_02.__r._4_4_ = in_stack_fffffffffffff9ac;
                    timeout_02.__r._0_4_ = in_stack_fffffffffffff9a8;
                    local_4f4 = InterruptibleRecv((uint8_t *)
                                                  CONCAT17(in_stack_fffffffffffff95f,
                                                           CONCAT16(in_stack_fffffffffffff95e,
                                                                    in_stack_fffffffffffff958)),
                                                  (size_t)in_stack_fffffffffffff950,timeout_02,
                                                  (Sock *)in_stack_fffffffffffff948);
LAB_01988627:
                    if (local_4f4 == OK) {
                      timeout_06.__r._4_4_ = in_stack_fffffffffffff9ac;
                      timeout_06.__r._0_4_ = in_stack_fffffffffffff9a8;
                      IVar4 = InterruptibleRecv((uint8_t *)
                                                CONCAT17(in_stack_fffffffffffff95f,
                                                         CONCAT16(in_stack_fffffffffffff95e,
                                                                  in_stack_fffffffffffff958)),
                                                (size_t)in_stack_fffffffffffff950,timeout_06,
                                                (Sock *)in_stack_fffffffffffff948);
                      if (IVar4 == OK) {
                        bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffff92c,
                                                           in_stack_fffffffffffff928),Trace);
                        if (bVar2) {
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                          logging_function_16._M_str._0_7_ = in_stack_fffffffffffff9f8;
                          logging_function_16._M_len = (size_t)puVar10;
                          logging_function_16._M_str._7_1_ = uVar1;
                          source_file_16._M_len._4_4_ = IVar3;
                          source_file_16._M_len._0_4_ = in_stack_fffffffffffff9e0;
                          source_file_16._M_str = (char *)plVar9;
                          LogPrintFormatInternal<std::__cxx11::string>
                                    (logging_function_16,source_file_16,iVar8,
                                     (LogFlags)__first._M_current,in_stack_fffffffffffffad0,
                                     (ConstevalFormatString<1U>)in_stack_fffffffffffff9d8.fmt,
                                     in_stack_fffffffffffffae0);
                          in_stack_fffffffffffff938 = in_RDI;
                        }
                        local_4d1 = 1;
                      }
                      else {
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                        logging_function_15._M_str._0_7_ = in_stack_fffffffffffff9f8;
                        logging_function_15._M_len = (size_t)puVar10;
                        logging_function_15._M_str._7_1_ = uVar1;
                        source_file_15._M_len._4_4_ = IVar3;
                        source_file_15._M_len._0_4_ = in_stack_fffffffffffff9e0;
                        source_file_15._M_str = (char *)plVar9;
                        LogPrintFormatInternal<>
                                  (logging_function_15,source_file_15,iVar8,
                                   (LogFlags)__first._M_current,in_stack_fffffffffffffad0,
                                   in_stack_fffffffffffff9d8);
                        local_4d1 = 0;
                      }
                    }
                    else {
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                      logging_function_14._M_str._0_7_ = in_stack_fffffffffffff9f8;
                      logging_function_14._M_len = (size_t)puVar10;
                      logging_function_14._M_str._7_1_ = uVar1;
                      source_file_14._M_len._4_4_ = IVar3;
                      source_file_14._M_len._0_4_ = in_stack_fffffffffffff9e0;
                      source_file_14._M_str = (char *)plVar9;
                      LogPrintFormatInternal<>
                                (logging_function_14,source_file_14,iVar8,
                                 (LogFlags)__first._M_current,in_stack_fffffffffffffad0,
                                 in_stack_fffffffffffff9d8);
                      local_4d1 = 0;
                    }
                  }
                  else if (local_12d == '\x03') {
                    timeout_04.__r._4_4_ = in_stack_fffffffffffff9ac;
                    timeout_04.__r._0_4_ = in_stack_fffffffffffff9a8;
                    IVar4 = InterruptibleRecv((uint8_t *)
                                              CONCAT17(in_stack_fffffffffffff95f,
                                                       CONCAT16(in_stack_fffffffffffff95e,
                                                                in_stack_fffffffffffff958)),
                                              (size_t)in_stack_fffffffffffff950,timeout_04,
                                              (Sock *)in_stack_fffffffffffff948);
                    if (IVar4 == OK) {
                      timeout_05.__r._4_4_ = in_stack_fffffffffffff9ac;
                      timeout_05.__r._0_4_ = in_stack_fffffffffffff9a8;
                      local_4f4 = InterruptibleRecv((uint8_t *)
                                                    CONCAT17(in_stack_fffffffffffff95f,
                                                             CONCAT16(in_stack_fffffffffffff95e,
                                                                      in_stack_fffffffffffff958)),
                                                    (size_t)in_stack_fffffffffffff950,timeout_05,
                                                    (Sock *)in_stack_fffffffffffff948);
                      goto LAB_01988627;
                    }
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                    logging_function_12._M_str._0_7_ = in_stack_fffffffffffff9f8;
                    logging_function_12._M_len = (size_t)puVar10;
                    logging_function_12._M_str._7_1_ = uVar1;
                    source_file_12._M_len._4_4_ = IVar3;
                    source_file_12._M_len._0_4_ = in_stack_fffffffffffff9e0;
                    source_file_12._M_str = (char *)plVar9;
                    LogPrintFormatInternal<>
                              (logging_function_12,source_file_12,iVar8,(LogFlags)__first._M_current
                               ,in_stack_fffffffffffffad0,in_stack_fffffffffffff9d8);
                    local_4d1 = 0;
                  }
                  else {
                    if (local_12d == '\x04') {
                      timeout_03.__r._4_4_ = in_stack_fffffffffffff9ac;
                      timeout_03.__r._0_4_ = in_stack_fffffffffffff9a8;
                      local_4f4 = InterruptibleRecv((uint8_t *)
                                                    CONCAT17(in_stack_fffffffffffff95f,
                                                             CONCAT16(in_stack_fffffffffffff95e,
                                                                      in_stack_fffffffffffff958)),
                                                    (size_t)in_stack_fffffffffffff950,timeout_03,
                                                    (Sock *)in_stack_fffffffffffff948);
                      goto LAB_01988627;
                    }
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                    logging_function_13._M_str._0_7_ = in_stack_fffffffffffff9f8;
                    logging_function_13._M_len = (size_t)puVar10;
                    logging_function_13._M_str._7_1_ = uVar1;
                    source_file_13._M_len._4_4_ = IVar3;
                    source_file_13._M_len._0_4_ = in_stack_fffffffffffff9e0;
                    source_file_13._M_str = (char *)plVar9;
                    LogPrintFormatInternal<>
                              (logging_function_13,source_file_13,iVar8,(LogFlags)__first._M_current
                               ,in_stack_fffffffffffffad0,in_stack_fffffffffffff9d8);
                    local_4d1 = 0;
                  }
                }
                else {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                  logging_function_11._M_str._0_7_ = in_stack_fffffffffffff9f8;
                  logging_function_11._M_len = (size_t)puVar10;
                  logging_function_11._M_str._7_1_ = uVar1;
                  source_file_11._M_len._4_4_ = IVar3;
                  source_file_11._M_len._0_4_ = in_stack_fffffffffffff9e0;
                  source_file_11._M_str = (char *)plVar9;
                  LogPrintFormatInternal<>
                            (logging_function_11,source_file_11,iVar8,(LogFlags)__first._M_current,
                             in_stack_fffffffffffffad0,in_stack_fffffffffffff9d8);
                  local_4d1 = 0;
                }
              }
              else {
                bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffff92c,
                                                   in_stack_fffffffffffff928),Trace);
                if (bVar2) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
                  Socks5ErrorString_abi_cxx11_(err);
                  uVar7 = 1;
                  logging_function_10._M_str._0_7_ = in_stack_fffffffffffff9f8;
                  logging_function_10._M_len = (size_t)puVar10;
                  logging_function_10._M_str._7_1_ = uVar1;
                  source_file_10._M_len._4_4_ = IVar3;
                  source_file_10._M_len._0_4_ = in_stack_fffffffffffff9e0;
                  source_file_10._M_str = (char *)plVar9;
                  LogPrintFormatInternal<std::__cxx11::string,unsigned_short,std::__cxx11::string>
                            (logging_function_10,source_file_10,iVar8,(LogFlags)__first._M_current,
                             in_stack_fffffffffffffad0,
                             (ConstevalFormatString<3U>)in_stack_fffffffffffff9d8.fmt,
                             in_stack_fffffffffffffae0,(unsigned_short *)in_stack_fffffffffffffae8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffaf0);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff92c,uVar7));
                  in_stack_fffffffffffff938 = in_RDI;
                }
                local_4d1 = 0;
              }
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
              logging_function_09._M_str._0_7_ = in_stack_fffffffffffff9f8;
              logging_function_09._M_len = (size_t)puVar10;
              logging_function_09._M_str._7_1_ = uVar1;
              source_file_09._M_len._4_4_ = IVar3;
              source_file_09._M_len._0_4_ = in_stack_fffffffffffff9e0;
              source_file_09._M_str = (char *)plVar9;
              LogPrintFormatInternal<>
                        (logging_function_09,source_file_09,iVar8,(LogFlags)__first._M_current,
                         in_stack_fffffffffffffad0,in_stack_fffffffffffff9d8);
              local_4d1 = 0;
            }
          }
          else if (IVar4 == Timeout) {
            local_4d1 = 0;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
            logging_function_08._M_str._0_7_ = in_stack_fffffffffffff9f8;
            logging_function_08._M_len = (size_t)puVar10;
            logging_function_08._M_str._7_1_ = uVar1;
            source_file_08._M_len._4_4_ = IVar3;
            source_file_08._M_len._0_4_ = in_stack_fffffffffffff9e0;
            source_file_08._M_str = (char *)plVar9;
            LogPrintFormatInternal<>
                      (logging_function_08,source_file_08,iVar8,(LogFlags)__first._M_current,
                       in_stack_fffffffffffffad0,in_stack_fffffffffffff9d8);
            local_4d1 = 0;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff938);
        }
      }
      else {
        if ((char)local_129[0]._M_dataplus._M_p == '\0') goto LAB_01987dc4;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
        iVar8 = (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
        in_stack_fffffffffffff938 = local_129;
        logging_function_07._M_str._0_7_ = in_stack_fffffffffffff9f8;
        logging_function_07._M_len = (size_t)puVar10;
        logging_function_07._M_str._7_1_ = uVar1;
        source_file_07._M_len._4_4_ = IVar3;
        source_file_07._M_len._0_4_ = in_stack_fffffffffffff9e0;
        source_file_07._M_str = (char *)plVar9;
        LogPrintFormatInternal<unsigned_char>
                  (logging_function_07,source_file_07,iVar8,
                   (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffff9d8.fmt,
                   (uchar *)in_stack_fffffffffffffae0);
        local_4d1 = 0;
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
      iVar8 = (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
      logging_function_02._M_str._0_7_ = in_stack_fffffffffffff9f8;
      logging_function_02._M_len = (size_t)puVar10;
      logging_function_02._M_str._7_1_ = uVar1;
      source_file_02._M_len._4_4_ = IVar3;
      source_file_02._M_len._0_4_ = in_stack_fffffffffffff9e0;
      source_file_02._M_str = (char *)plVar9;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,iVar8,
                 (LogFlags)in_stack_fffffffffffff990._M_current,0x1e9b6c5,in_stack_fffffffffffff9d8)
      ;
      local_4d1 = 0;
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    iVar8 = (int)((ulong)in_stack_fffffffffffff998._M_current >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    logging_function_01._M_str._0_7_ = in_stack_fffffffffffff9f8;
    logging_function_01._M_len = (size_t)puVar10;
    logging_function_01._M_str._7_1_ = uVar1;
    source_file_01._M_len._4_4_ = IVar3;
    source_file_01._M_len._0_4_ = in_stack_fffffffffffff9e0;
    source_file_01._M_str = (char *)plVar9;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_short>
              (logging_function_01,source_file_01,iVar8,
               (LogFlags)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffffad0,
               (ConstevalFormatString<2U>)in_stack_fffffffffffff9d8.fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "Socks5() connect to %s:%d failed: InterruptibleRecv() timeout or other failure\n",
               (unsigned_short *)in_stack_fffffffffffffae8);
    local_4d1 = 0;
    in_stack_fffffffffffff938 = in_RDI;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff938);
LAB_019889ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_4d1 & 1);
}

Assistant:

bool Socks5(const std::string& strDest, uint16_t port, const ProxyCredentials* auth, const Sock& sock)
{
    try {
        IntrRecvError recvr;
        LogDebug(BCLog::NET, "SOCKS5 connecting %s\n", strDest);
        if (strDest.size() > 255) {
            LogError("Hostname too long\n");
            return false;
        }
        // Construct the version identifier/method selection message
        std::vector<uint8_t> vSocks5Init;
        vSocks5Init.push_back(SOCKSVersion::SOCKS5); // We want the SOCK5 protocol
        if (auth) {
            vSocks5Init.push_back(0x02); // 2 method identifiers follow...
            vSocks5Init.push_back(SOCKS5Method::NOAUTH);
            vSocks5Init.push_back(SOCKS5Method::USER_PASS);
        } else {
            vSocks5Init.push_back(0x01); // 1 method identifier follows...
            vSocks5Init.push_back(SOCKS5Method::NOAUTH);
        }
        sock.SendComplete(vSocks5Init, g_socks5_recv_timeout, g_socks5_interrupt);
        uint8_t pchRet1[2];
        if (InterruptibleRecv(pchRet1, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
            LogPrintf("Socks5() connect to %s:%d failed: InterruptibleRecv() timeout or other failure\n", strDest, port);
            return false;
        }
        if (pchRet1[0] != SOCKSVersion::SOCKS5) {
            LogError("Proxy failed to initialize\n");
            return false;
        }
        if (pchRet1[1] == SOCKS5Method::USER_PASS && auth) {
            // Perform username/password authentication (as described in RFC1929)
            std::vector<uint8_t> vAuth;
            vAuth.push_back(0x01); // Current (and only) version of user/pass subnegotiation
            if (auth->username.size() > 255 || auth->password.size() > 255) {
                LogError("Proxy username or password too long\n");
                return false;
            }
            vAuth.push_back(auth->username.size());
            vAuth.insert(vAuth.end(), auth->username.begin(), auth->username.end());
            vAuth.push_back(auth->password.size());
            vAuth.insert(vAuth.end(), auth->password.begin(), auth->password.end());
            sock.SendComplete(vAuth, g_socks5_recv_timeout, g_socks5_interrupt);
            LogDebug(BCLog::PROXY, "SOCKS5 sending proxy authentication %s:%s\n", auth->username, auth->password);
            uint8_t pchRetA[2];
            if (InterruptibleRecv(pchRetA, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
                LogError("Error reading proxy authentication response\n");
                return false;
            }
            if (pchRetA[0] != 0x01 || pchRetA[1] != 0x00) {
                LogError("Proxy authentication unsuccessful\n");
                return false;
            }
        } else if (pchRet1[1] == SOCKS5Method::NOAUTH) {
            // Perform no authentication
        } else {
            LogError("Proxy requested wrong authentication method %02x\n", pchRet1[1]);
            return false;
        }
        std::vector<uint8_t> vSocks5;
        vSocks5.push_back(SOCKSVersion::SOCKS5);   // VER protocol version
        vSocks5.push_back(SOCKS5Command::CONNECT); // CMD CONNECT
        vSocks5.push_back(0x00);                   // RSV Reserved must be 0
        vSocks5.push_back(SOCKS5Atyp::DOMAINNAME); // ATYP DOMAINNAME
        vSocks5.push_back(strDest.size());         // Length<=255 is checked at beginning of function
        vSocks5.insert(vSocks5.end(), strDest.begin(), strDest.end());
        vSocks5.push_back((port >> 8) & 0xFF);
        vSocks5.push_back((port >> 0) & 0xFF);
        sock.SendComplete(vSocks5, g_socks5_recv_timeout, g_socks5_interrupt);
        uint8_t pchRet2[4];
        if ((recvr = InterruptibleRecv(pchRet2, 4, g_socks5_recv_timeout, sock)) != IntrRecvError::OK) {
            if (recvr == IntrRecvError::Timeout) {
                /* If a timeout happens here, this effectively means we timed out while connecting
                 * to the remote node. This is very common for Tor, so do not print an
                 * error message. */
                return false;
            } else {
                LogError("Error while reading proxy response\n");
                return false;
            }
        }
        if (pchRet2[0] != SOCKSVersion::SOCKS5) {
            LogError("Proxy failed to accept request\n");
            return false;
        }
        if (pchRet2[1] != SOCKS5Reply::SUCCEEDED) {
            // Failures to connect to a peer that are not proxy errors
            LogPrintLevel(BCLog::NET, BCLog::Level::Debug,
                          "Socks5() connect to %s:%d failed: %s\n", strDest, port, Socks5ErrorString(pchRet2[1]));
            return false;
        }
        if (pchRet2[2] != 0x00) { // Reserved field must be 0
            LogError("Error: malformed proxy response\n");
            return false;
        }
        uint8_t pchRet3[256];
        switch (pchRet2[3]) {
        case SOCKS5Atyp::IPV4: recvr = InterruptibleRecv(pchRet3, 4, g_socks5_recv_timeout, sock); break;
        case SOCKS5Atyp::IPV6: recvr = InterruptibleRecv(pchRet3, 16, g_socks5_recv_timeout, sock); break;
        case SOCKS5Atyp::DOMAINNAME: {
            recvr = InterruptibleRecv(pchRet3, 1, g_socks5_recv_timeout, sock);
            if (recvr != IntrRecvError::OK) {
                LogError("Error reading from proxy\n");
                return false;
            }
            int nRecv = pchRet3[0];
            recvr = InterruptibleRecv(pchRet3, nRecv, g_socks5_recv_timeout, sock);
            break;
        }
        default: {
            LogError("Error: malformed proxy response\n");
            return false;
        }
        }
        if (recvr != IntrRecvError::OK) {
            LogError("Error reading from proxy\n");
            return false;
        }
        if (InterruptibleRecv(pchRet3, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
            LogError("Error reading from proxy\n");
            return false;
        }
        LogDebug(BCLog::NET, "SOCKS5 connected %s\n", strDest);
        return true;
    } catch (const std::runtime_error& e) {
        LogError("Error during SOCKS5 proxy handshake: %s\n", e.what());
        return false;
    }
}